

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ProgramInfoLogCase::test(ProgramInfoLogCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  TestContext *pTVar2;
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  GLint written;
  StateQueryMemoryWriteGuard<int> logLength;
  char buffer [2048];
  GLsizei local_9d0;
  GLuint local_9cc;
  StateQueryMemoryWriteGuard<int> local_9c8;
  undefined1 local_9b8 [120];
  ios_base local_940 [264];
  GLchar local_838 [2056];
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource
            (this_00,shader,1,&Functional::(anonymous_namespace)::brokenShader,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource
            (this_00,shader_00,1,&Functional::(anonymous_namespace)::brokenShader,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glCompileShader(this_00,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  local_9cc = shader;
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader_00);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  memset(local_838,0,0x800);
  local_838[0] = 'x';
  local_9d0 = 0;
  glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x800,&local_9d0,local_838);
  local_9c8.m_preguard = -0x21212122;
  local_9c8.m_value = -0x21212122;
  local_9c8.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b84,&local_9c8.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            (&local_9c8,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
            );
  if ((local_9c8.m_value != 0) && (local_9d0 + 1 != local_9c8.m_value)) {
    local_9b8._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_9b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected INFO_LOG_LENGTH ",0x23);
    std::ostream::operator<<(poVar1,local_9d0 + 1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"; got ",6);
    std::ostream::operator<<(poVar1,local_9c8.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_940);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got invalid log length");
    }
  }
  memset(local_838,0,0x800);
  local_838[0] = 'x';
  local_9c8._0_8_ = local_9c8._0_8_ & 0xffffffff00000000;
  glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,1,&local_9c8.m_preguard,local_838);
  if (local_9c8.m_preguard != 0) {
    local_9b8._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_9b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Expected write length 0; got ",0x27);
    std::ostream::operator<<(poVar1,local_9c8.m_preguard);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_9b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_940);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got invalid log length");
    }
  }
  glu::CallLogWrapper::glDeleteShader(this_00,local_9cc);
  glu::CallLogWrapper::glDeleteShader(this_00,shader_00);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &brokenShader, DE_NULL);
		glShaderSource(shaderFrag, 1, &brokenShader, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);

		// check INFO_LOG_LENGTH == GetProgramInfoLog len
		{
			char buffer[2048] = {'x'};

			GLint written = 0;
			glGetProgramInfoLog(program, DE_LENGTH_OF_ARRAY(buffer), &written, buffer);

			StateQueryMemoryWriteGuard<GLint> logLength;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &logLength);
			logLength.verifyValidity(m_testCtx);

			if (logLength != 0 && written+1 != logLength) // INFO_LOG_LENGTH contains 0-terminator
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected INFO_LOG_LENGTH " << written+1 << "; got " << logLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
		}

		// check GetProgramInfoLog works with too small buffer
		{
			char buffer[2048] = {'x'};

			GLint written = 0;
			glGetProgramInfoLog(program, 1, &written, buffer);

			if (written != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected write length 0; got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid log length");
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}